

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

utf8_size_t utf8_wrap_length(utf8_char_t *data,utf8_size_t size)

{
  int iVar1;
  size_t sVar2;
  ulong in_RSI;
  utf8_char_t *in_RDI;
  size_t split_at;
  size_t char_count;
  size_t char_length;
  utf8_size_t local_30;
  ulong local_28;
  utf8_char_t *local_10;
  
  local_28 = 0;
  local_30 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (in_RSI < local_28) {
      return local_30;
    }
    sVar2 = _utf8_newline(local_10);
    if (sVar2 != 0) break;
    iVar1 = utf8_char_whitespace(local_10);
    if (iVar1 != 0) {
      local_30 = local_28;
    }
    sVar2 = utf8_char_length(local_10);
    local_10 = local_10 + sVar2;
    local_28 = local_28 + 1;
  }
  return local_28;
}

Assistant:

utf8_size_t utf8_wrap_length(const utf8_char_t* data, utf8_size_t size)
{
    // Set split_at to size, so if a split point cna not be found, retuns the size passed in
    size_t char_length, char_count, split_at = size;

    for (char_count = 0; char_count <= size; ++char_count) {
        if (_utf8_newline(data)) {
            return char_count;
        } else if (utf8_char_whitespace(data)) {
            split_at = char_count;
        }

        char_length = utf8_char_length(data);
        data += char_length;
    }

    return split_at;
}